

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_aspect_stream.c
# Opt level: O0

log_aspect_interface log_aspect_stream_interface(void)

{
  return &log_aspect_stream_interface::aspect_interface_stream;
}

Assistant:

log_aspect_interface log_aspect_stream_interface(void)
{
	static struct log_aspect_stream_impl_type log_aspect_stream_impl_obj = {
		&log_aspect_stream_impl_write,
		&log_aspect_stream_impl_flush
	};

	static struct log_aspect_interface_type aspect_interface_stream = {
		&log_aspect_stream_create,
		&log_aspect_stream_impl_obj,
		&log_aspect_stream_destroy
	};

	return &aspect_interface_stream;
}